

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O1

Texture * __thiscall
Assimp::LWOImporter::SetupNewTextureLWOB(LWOImporter *this,TextureList *list,uint size)

{
  uint8_t *puVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  uint8_t *puVar4;
  long lVar5;
  char *pcVar6;
  Logger *pLVar7;
  char *pcVar8;
  string type;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [48];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [3];
  ios_base local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120 [15];
  
  LWO::Texture::Texture((Texture *)local_1a8);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::
  _M_insert<Assimp::LWO::Texture>(list,(iterator)list,(Texture *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != local_120) {
    operator_delete(local_130._M_p,local_120[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != local_168) {
    operator_delete(local_178._M_p,local_168[0]._M_allocated_capacity + 1);
  }
  pcVar2 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  p_Var3 = (list->super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>).
           _M_impl._M_node.super__List_node_base._M_prev;
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  puVar4 = this->mFileBuffer;
  if (*puVar4 != '\0') {
    lVar5 = 1;
    do {
      if (size < (uint)lVar5) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"LWO: Invalid file, string is is too long");
        break;
      }
      this->mFileBuffer = puVar4 + lVar5;
      puVar1 = puVar4 + lVar5;
      lVar5 = lVar5 + 1;
    } while (*puVar1 != '\0');
  }
  puVar1 = this->mFileBuffer;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,puVar4,puVar1);
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar8 = local_1e8;
  this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar1 - (int)puVar4 & 1));
  pcVar6 = strstr(local_1e8,"Image Map");
  if (pcVar6 == (char *)0x0) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[35]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [35])"LWOB: Unsupported legacy texture: ");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1e8,local_1e0);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar7,(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    pcVar6 = strstr(pcVar8,"Planar");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strstr(pcVar8,"Cylindrical");
      if (pcVar6 == (char *)0x0) {
        pcVar6 = strstr(pcVar8,"Spherical");
        if (pcVar6 == (char *)0x0) {
          pcVar6 = strstr(pcVar8,"Cubic");
          if (pcVar6 == (char *)0x0) {
            pcVar8 = strstr(pcVar8,"Front");
            if (pcVar8 != (char *)0x0) {
              *(undefined4 *)&p_Var3[7]._M_next = 4;
            }
          }
          else {
            *(undefined4 *)&p_Var3[7]._M_next = 3;
          }
        }
        else {
          *(undefined4 *)&p_Var3[7]._M_next = 2;
        }
      }
      else {
        *(undefined4 *)&p_Var3[7]._M_next = 1;
      }
    }
    else {
      *(undefined4 *)&p_Var3[7]._M_next = 0;
    }
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  return (Texture *)(p_Var3 + 1);
}

Assistant:

LWO::Texture* LWOImporter::SetupNewTextureLWOB(LWO::TextureList& list,unsigned int size)
{
    list.push_back(LWO::Texture());
    LWO::Texture* tex = &list.back();

    std::string type;
    GetS0(type,size);
    const char* s = type.c_str();

    if(strstr(s, "Image Map"))
    {
        // Determine mapping type
        if(strstr(s, "Planar"))
            tex->mapMode = LWO::Texture::Planar;
        else if(strstr(s, "Cylindrical"))
            tex->mapMode = LWO::Texture::Cylindrical;
        else if(strstr(s, "Spherical"))
            tex->mapMode = LWO::Texture::Spherical;
        else if(strstr(s, "Cubic"))
            tex->mapMode = LWO::Texture::Cubic;
        else if(strstr(s, "Front"))
            tex->mapMode = LWO::Texture::FrontProjection;
    }
    else
    {
        // procedural or gradient, not supported
        ASSIMP_LOG_ERROR_F("LWOB: Unsupported legacy texture: ", type);
    }

    return tex;
}